

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

bool __thiscall amrex::TagBoxArray::hasTags(TagBoxArray *this,Box *a_bx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int j;
  int iVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  MFIter mfi;
  Array4<const_char> local_d0;
  MFIter local_90;
  
  bVar21 = false;
  MFIter::MFIter(&local_90,(FabArrayBase *)this,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    bVar21 = false;
    do {
      FabArrayBase::fabbox
                ((Box *)&local_d0,local_90.fabArray,
                 ((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_90.currentIndex]);
      iVar13 = (int)local_d0.jstride;
      iVar12 = local_d0.p._4_4_;
      iVar11 = (int)local_d0.p;
      iVar1 = (a_bx->smallend).vect[0];
      iVar2 = (a_bx->smallend).vect[1];
      iVar3 = (a_bx->smallend).vect[2];
      iVar4 = (a_bx->bigend).vect[0];
      iVar5 = (a_bx->bigend).vect[1];
      iVar6 = (a_bx->bigend).vect[2];
      iVar7 = (int)local_d0.p;
      if ((int)local_d0.p < iVar1) {
        iVar7 = iVar1;
      }
      iVar8 = local_d0.p._4_4_;
      if (local_d0.p._4_4_ < iVar2) {
        iVar8 = iVar2;
      }
      iVar18 = (int)local_d0.jstride;
      if ((int)local_d0.jstride < iVar3) {
        iVar18 = iVar3;
      }
      iVar9 = local_d0.jstride._4_4_;
      if (iVar4 < local_d0.jstride._4_4_) {
        iVar9 = iVar4;
      }
      iVar4 = (int)local_d0.kstride;
      if (iVar5 < (int)local_d0.kstride) {
        iVar4 = iVar5;
      }
      iVar5 = local_d0.kstride._4_4_;
      if (iVar6 < local_d0.kstride._4_4_) {
        iVar5 = iVar6;
      }
      if ((((iVar7 <= iVar9) && (iVar8 <= iVar4)) && (iVar18 <= iVar5)) && ((a_bx->btype).itype < 8)
         ) {
        FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>
                  (&local_d0,&this->super_FabArray<amrex::TagBox>,&local_90);
        if (iVar1 < iVar11) {
          iVar1 = iVar11;
        }
        if (iVar2 < iVar12) {
          iVar2 = iVar12;
        }
        lVar14 = (long)iVar2;
        if (iVar3 < iVar13) {
          iVar3 = iVar13;
        }
        lVar15 = (long)iVar3;
        lVar16 = (((lVar14 - local_d0.begin.y) *
                   CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride) +
                  (lVar15 - local_d0.begin.z) *
                  CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride) + (long)iVar1) -
                 (long)local_d0.begin.x) + CONCAT44(local_d0.p._4_4_,(int)local_d0.p);
        lVar19 = lVar14;
        lVar17 = lVar16;
        do {
          do {
            lVar20 = 0;
            do {
              bVar10 = !bVar21;
              bVar21 = true;
              if (bVar10) {
                bVar21 = *(char *)(lVar16 + lVar20) != '\0';
              }
              lVar20 = lVar20 + 1;
            } while ((iVar9 - iVar1) + 1 != (int)lVar20);
            lVar19 = lVar19 + 1;
            lVar16 = lVar16 + CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride);
          } while (((iVar4 + iVar2) - iVar8) + 1 != (int)lVar19);
          lVar15 = lVar15 + 1;
          lVar16 = lVar17 + CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride);
          lVar19 = lVar14;
          lVar17 = lVar16;
        } while (((iVar5 + iVar3) - iVar18) + 1 != (int)lVar15);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return bVar21;
}

Assistant:

bool
TagBoxArray::hasTags (Box const& a_bx) const
{
    bool has_tags = false;
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpLogicalOr> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            Box const& b = a_bx & mfi.fabbox();
            if (b.ok()) {
                const auto& arr = this->const_array(mfi);
                reduce_op.eval(b, reduce_data,
                [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
                {
                    int tr = arr(i,j,k) != TagBox::CLEAR;
                    return {tr};
                });
            }
        }

        ReduceTuple hv = reduce_data.value(reduce_op);
        has_tags = static_cast<bool>(amrex::get<0>(hv));
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(||:has_tags)
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            Box const& b = a_bx & mfi.fabbox();
            if (b.ok()) {
                Array4<char const> const& arr = this->const_array(mfi);
                AMREX_LOOP_3D(b, i, j, k,
                {
                    has_tags = has_tags || (arr(i,j,k) != TagBox::CLEAR);
                });
            }
        }
    }

    ParallelAllReduce::Or(has_tags, ParallelContext::CommunicatorSub());
    return has_tags;
}